

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O2

int header_odc(archive_read *a,cpio *cpio,archive_entry *entry,size_t *namelength,size_t *name_pad)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  void *pvVar4;
  dev_t dVar5;
  int64_t iVar6;
  size_t sVar7;
  long lVar8;
  char *pcVar9;
  char *len;
  ulong uVar10;
  size_t local_38;
  
  (a->archive).archive_format = 0x10001;
  (a->archive).archive_format_name = "POSIX octet-oriented cpio";
  lVar3 = 0;
  while( true ) {
    pcVar2 = (char *)__archive_read_ahead(a,0x4c,(ssize_t *)&local_38);
    sVar7 = local_38;
    if (pcVar2 == (char *)0x0) {
      return -0x1e;
    }
    pcVar9 = pcVar2;
    iVar1 = bcmp("070707",pcVar2,6);
    if ((iVar1 == 0) && (iVar1 = is_octal(pcVar2,(size_t)pcVar9), iVar1 != 0)) break;
    iVar1 = bcmp("070727",pcVar2,6);
    if ((iVar1 == 0) && (iVar1 = is_afio_large(pcVar2,sVar7), iVar1 != 0)) {
      iVar1 = 0;
      goto LAB_001327da;
    }
    for (pcVar9 = pcVar2; pcVar9 + 0x4c <= pcVar2 + sVar7; pcVar9 = pcVar9 + lVar8) {
      lVar8 = 1;
      if (((pcVar9[5] != '0') && (lVar8 = 6, pcVar9[5] == '7')) &&
         (((len = pcVar9, iVar1 = bcmp("070707",pcVar9,6), iVar1 == 0 &&
           (iVar1 = is_octal(pcVar9,(size_t)len), iVar1 != 0)) ||
          ((iVar1 = bcmp("070727",pcVar9,6), lVar8 = 2, iVar1 == 0 &&
           (iVar1 = is_afio_large(pcVar9,(long)(pcVar2 + sVar7) - (long)pcVar9), iVar1 != 0)))))) {
        __archive_read_consume(a,(long)pcVar9 - (long)pcVar2);
        uVar10 = ((long)pcVar9 - (long)pcVar2) + lVar3;
        if (pcVar9[4] == '2') {
          (a->archive).archive_format = 0x10006;
        }
        if (uVar10 == 0) {
          iVar1 = 0;
        }
        else {
          archive_set_error(&a->archive,0,"Skipped %d bytes before finding valid header",
                            uVar10 & 0xffffffff);
          iVar1 = -0x14;
        }
        goto LAB_001327c8;
      }
    }
    __archive_read_consume(a,(long)pcVar9 - (long)pcVar2);
    lVar3 = lVar3 + ((long)pcVar9 - (long)pcVar2);
  }
  iVar1 = 0;
LAB_001327c8:
  if ((a->archive).archive_format != 0x10006) {
    pvVar4 = __archive_read_ahead(a,0x4c,(ssize_t *)0x0);
    if (pvVar4 == (void *)0x0) {
      return -0x1e;
    }
    dVar5 = atol8((char *)((long)pvVar4 + 6),6);
    archive_entry_set_dev(entry,dVar5);
    iVar6 = atol8((char *)((long)pvVar4 + 0xc),6);
    archive_entry_set_ino(entry,iVar6);
    iVar6 = atol8((char *)((long)pvVar4 + 0x12),6);
    archive_entry_set_mode(entry,(mode_t)iVar6);
    iVar6 = atol8((char *)((long)pvVar4 + 0x18),6);
    archive_entry_set_uid(entry,iVar6);
    iVar6 = atol8((char *)((long)pvVar4 + 0x1e),6);
    archive_entry_set_gid(entry,iVar6);
    iVar6 = atol8((char *)((long)pvVar4 + 0x24),6);
    archive_entry_set_nlink(entry,(uint)iVar6);
    dVar5 = atol8((char *)((long)pvVar4 + 0x2a),6);
    archive_entry_set_rdev(entry,dVar5);
    iVar6 = atol8((char *)((long)pvVar4 + 0x30),0xb);
    archive_entry_set_mtime(entry,iVar6,0);
    sVar7 = atol8((char *)((long)pvVar4 + 0x3b),6);
    *namelength = sVar7;
    *name_pad = 0;
    iVar6 = atol8((char *)((long)pvVar4 + 0x41),0xb);
    cpio->entry_bytes_remaining = iVar6;
    archive_entry_set_size(entry,iVar6);
    cpio->entry_padding = 0;
    __archive_read_consume(a,0x4c);
    return iVar1;
  }
LAB_001327da:
  (a->archive).archive_format = 0x10006;
  (a->archive).archive_format_name = "afio large ASCII";
  pvVar4 = __archive_read_ahead(a,0x74,(ssize_t *)0x0);
  if (pvVar4 == (void *)0x0) {
    return -0x1e;
  }
  dVar5 = atol16((char *)((long)pvVar4 + 6),8);
  archive_entry_set_dev(entry,dVar5);
  iVar6 = atol16((char *)((long)pvVar4 + 0xe),0x10);
  if (iVar6 < 0) {
    pcVar2 = "Nonsensical ino value";
  }
  else {
    archive_entry_set_ino(entry,iVar6);
    iVar6 = atol8((char *)((long)pvVar4 + 0x1f),6);
    archive_entry_set_mode(entry,(mode_t)iVar6);
    iVar6 = atol16((char *)((long)pvVar4 + 0x25),8);
    archive_entry_set_uid(entry,iVar6);
    iVar6 = atol16((char *)((long)pvVar4 + 0x2d),8);
    archive_entry_set_gid(entry,iVar6);
    iVar6 = atol16((char *)((long)pvVar4 + 0x35),8);
    archive_entry_set_nlink(entry,(uint)iVar6);
    dVar5 = atol16((char *)((long)pvVar4 + 0x3d),8);
    archive_entry_set_rdev(entry,dVar5);
    iVar6 = atol16((char *)((long)pvVar4 + 0x45),0x10);
    archive_entry_set_mtime(entry,iVar6,0);
    sVar7 = atol16((char *)((long)pvVar4 + 0x56),4);
    *namelength = sVar7;
    *name_pad = 0;
    iVar6 = atol16((char *)((long)pvVar4 + 99),0x10);
    if (-1 < iVar6) {
      cpio->entry_bytes_remaining = iVar6;
      archive_entry_set_size(entry,iVar6);
      cpio->entry_padding = 0;
      __archive_read_consume(a,0x74);
      return iVar1;
    }
    pcVar2 = "Nonsensical file size";
  }
  archive_set_error(&a->archive,0,pcVar2);
  return -0x1e;
}

Assistant:

static int
header_odc(struct archive_read *a, struct cpio *cpio,
    struct archive_entry *entry, size_t *namelength, size_t *name_pad)
{
	const void *h;
	int r;
	const char *header;

	a->archive.archive_format = ARCHIVE_FORMAT_CPIO_POSIX;
	a->archive.archive_format_name = "POSIX octet-oriented cpio";

	/* Find the start of the next header. */
	r = find_odc_header(a);
	if (r < ARCHIVE_WARN)
		return (r);

	if (a->archive.archive_format == ARCHIVE_FORMAT_CPIO_AFIO_LARGE) {
		int r2 = (header_afiol(a, cpio, entry, namelength, name_pad));
		if (r2 == ARCHIVE_OK)
			return (r);
		else
			return (r2);
	}

	/* Read fixed-size portion of header. */
	h = __archive_read_ahead(a, odc_header_size, NULL);
	if (h == NULL)
	    return (ARCHIVE_FATAL);

	/* Parse out octal fields. */
	header = (const char *)h;

	archive_entry_set_dev(entry, 
		(dev_t)atol8(header + odc_dev_offset, odc_dev_size));
	archive_entry_set_ino(entry, atol8(header + odc_ino_offset, odc_ino_size));
	archive_entry_set_mode(entry, 
		(mode_t)atol8(header + odc_mode_offset, odc_mode_size));
	archive_entry_set_uid(entry, atol8(header + odc_uid_offset, odc_uid_size));
	archive_entry_set_gid(entry, atol8(header + odc_gid_offset, odc_gid_size));
	archive_entry_set_nlink(entry, 
		(unsigned int)atol8(header + odc_nlink_offset, odc_nlink_size));
	archive_entry_set_rdev(entry,
		(dev_t)atol8(header + odc_rdev_offset, odc_rdev_size));
	archive_entry_set_mtime(entry, atol8(header + odc_mtime_offset, odc_mtime_size), 0);
	*namelength = (size_t)atol8(header + odc_namesize_offset, odc_namesize_size);
	*name_pad = 0; /* No padding of filename. */

	/*
	 * Note: entry_bytes_remaining is at least 64 bits and
	 * therefore guaranteed to be big enough for a 33-bit file
	 * size.
	 */
	cpio->entry_bytes_remaining =
	    atol8(header + odc_filesize_offset, odc_filesize_size);
	archive_entry_set_size(entry, cpio->entry_bytes_remaining);
	cpio->entry_padding = 0;
	__archive_read_consume(a, odc_header_size);
	return (r);
}